

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall SslTcpSocketImpl::SslTcpSocketImpl(SslTcpSocketImpl *this,BaseSocket *pBkref)

{
  SslTcpSocketImpl *local_90;
  code *local_88;
  undefined8 local_80;
  type local_78;
  SslTcpSocketImpl *local_50;
  code *local_48;
  undefined8 local_40;
  type local_38;
  anon_class_8_1_8991fb9c local_20;
  BaseSocket *local_18;
  BaseSocket *pBkref_local;
  SslTcpSocketImpl *this_local;
  
  local_18 = pBkref;
  pBkref_local = (BaseSocket *)this;
  TcpSocketImpl::TcpSocketImpl(&this->super_TcpSocketImpl,pBkref);
  (this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslTcpSocketImpl_001b7d90;
  OpenSSLWrapper::SslClientContext::SslClientContext(&this->m_pClientCtx);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  vector(&this->m_pServerCtx);
  std::unique_ptr<OpenSSLWrapper::SslConnection,std::default_delete<OpenSSLWrapper::SslConnection>>
  ::unique_ptr<std::default_delete<OpenSSLWrapper::SslConnection>,void>
            ((unique_ptr<OpenSSLWrapper::SslConnection,std::default_delete<OpenSSLWrapper::SslConnection>>
              *)&this->m_pSslCon);
  std::function<void_(TcpSocket_*)>::function(&this->m_fClientConnected);
  std::function<void_(TcpSocket_*,_void_*)>::function(&this->m_fClientConnectedParam);
  this->m_bCloseReq = false;
  this->m_iSslInit = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_vProtoList);
  std::__cxx11::string::string((string *)&this->m_strTrustRootCert);
  std::mutex::mutex(&this->m_mxEnDecode);
  local_20.this = this;
  std::function<int()>::operator=
            ((function<int()> *)&(this->super_TcpSocketImpl).m_fnSslInitDone,&local_20);
  local_48 = DatenEncode;
  local_40 = 0;
  local_50 = this;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long),SslTcpSocketImpl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_38,(offset_in_SslTcpSocketImpl_to_subr *)&local_48,&local_50,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             &(this->super_TcpSocketImpl).m_fnSslEncode,&local_38);
  local_88 = DatenDecode;
  local_80 = 0;
  local_90 = this;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long,bool&),SslTcpSocketImpl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_78,(offset_in_SslTcpSocketImpl_to_subr *)&local_88,&local_90,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             &(this->super_TcpSocketImpl).m_fnSslDecode,&local_78);
  return;
}

Assistant:

SslTcpSocketImpl::SslTcpSocketImpl(BaseSocket* pBkref) : TcpSocketImpl(pBkref), m_bCloseReq(false), m_iSslInit(0)
{
    m_fnSslInitDone = [this]() noexcept -> int { return m_iSslInit; };
    m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, this, _1, _2);
    m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, this, _1, _2, _3);
}